

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

SUNErrCode SUNMatSpace_Dense(SUNMatrix A,long *lenrw,long *leniw)

{
  void *pvVar1;
  
  pvVar1 = A->content;
  *lenrw = *(long *)((long)pvVar1 + 0x18);
  *leniw = *(long *)((long)pvVar1 + 8) + 3;
  return 0;
}

Assistant:

SUNErrCode SUNMatSpace_Dense(SUNMatrix A, long int* lenrw, long int* leniw)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_DENSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(lenrw, SUN_ERR_ARG_CORRUPT);
  SUNAssert(leniw, SUN_ERR_ARG_CORRUPT);
  *lenrw = SM_LDATA_D(A);
  *leniw = 3 + SM_COLUMNS_D(A);
  return SUN_SUCCESS;
}